

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FileClasses.h
# Opt level: O3

void __thiscall TextFile::writeFormat<char*>(TextFile *this,wchar_t *text,char **args)

{
  size_t in_RCX;
  void *__buf;
  wstring message;
  wstring local_30;
  
  formatString<char*>(&local_30,text,args);
  write(this,(int)&local_30,__buf,in_RCX);
  if ((anon_union_16_2_edb7204a_for_basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_11
       *)local_30._M_dataplus._M_p != &local_30.field_2) {
    operator_delete(local_30._M_dataplus._M_p);
  }
  return;
}

Assistant:

void writeFormat(const wchar_t* text, const Args&... args)
	{
		std::wstring message = formatString(text,args...);
		write(message);
	}